

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O3

Literal __thiscall
Clasp::Solver::popVars(Solver *this,uint32 num,bool popLearnt,ConstraintDB *popAux)

{
  size_type sVar1;
  pointer plVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  pointer pIVar6;
  pointer pLVar7;
  pointer ppCVar8;
  uint uVar9;
  size_type sVar10;
  int iVar11;
  undefined4 extraout_var;
  Literal *pLVar12;
  uint uVar13;
  uint32 uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  long *plVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  size_type ns;
  LitVec cc;
  Antecedent local_58;
  ulong uStack_50;
  ConstraintDB *local_40;
  ulong local_38;
  
  uVar22 = (this->assign_).assign_.ebo_.size - num;
  uVar3 = uVar22 * 4;
  uVar9 = (this->levels_).super_type.ebo_.size + 1;
  uVar18 = (ulong)(this->impliedLits_).lits.ebo_.size;
  if (uVar18 != 0) {
    pIVar6 = (this->impliedLits_).lits.ebo_.buf;
    lVar20 = 0;
    do {
      if ((uVar3 >> 1 <= *(uint *)((long)&(pIVar6->lit).rep_ + lVar20) >> 1) &&
         (uVar24 = *(uint *)((long)&pIVar6->level + lVar20), uVar24 < uVar9)) {
        uVar9 = uVar24;
      }
      lVar20 = lVar20 + 0x18;
    } while (uVar18 * 0x18 != lVar20);
  }
  local_38 = (ulong)(uVar22 & 0x3fffffff);
  if (num != 0) {
    uVar18 = local_38;
    uVar14 = num;
    do {
      uVar22 = (this->assign_).assign_.ebo_.buf[uVar18];
      uVar24 = uVar22 >> 4;
      if (uVar9 <= uVar24) {
        uVar24 = uVar9;
      }
      if ((uVar22 & 3) == 0) {
        uVar24 = uVar9;
      }
      uVar9 = uVar24;
      uVar18 = (ulong)((int)uVar18 + 1);
      uVar14 = uVar14 - 1;
    } while (uVar14 != 0);
  }
  uVar22 = (this->levels_).root;
  local_40 = popAux;
  if (uVar22 < uVar9) {
    undoUntil(this,uVar9 - 1,2);
  }
  else {
    popRootLevel(this,(uVar22 - uVar9) + 1,(LitVec *)0x0,true);
    if (uVar9 == 0) {
      uVar9 = this->shared_->lastTopLevel_;
      uVar22 = (this->assign_).units_;
      uVar24 = (this->assign_).front;
      uVar17 = *(uint *)&this->field_0x204;
      uVar13 = uVar17 & 0x3fffffff;
      uVar4 = (this->assign_).trail.ebo_.size;
      if (uVar9 != uVar4) {
        pLVar7 = (this->assign_).trail.ebo_.buf;
        uVar19 = uVar24;
        uVar15 = uVar22;
        uVar23 = uVar13;
        uVar17 = uVar9;
        do {
          uVar5 = pLVar7[uVar17].rep_;
          if (uVar5 >> 1 < uVar3 >> 1) {
            uVar18 = (ulong)uVar9;
            uVar9 = uVar9 + 1;
            pLVar7[uVar18].rep_ = uVar5;
          }
          else {
            uVar15 = uVar15 - (uVar17 < uVar22);
            uVar19 = uVar19 - (uVar17 < uVar24);
            uVar23 = uVar23 - (uVar17 < uVar13);
          }
          uVar17 = uVar17 + 1;
        } while (uVar4 != uVar17);
        uVar17 = *(uint *)&this->field_0x204;
        uVar13 = uVar23 & 0x3fffffff;
        uVar24 = uVar19;
        uVar22 = uVar15;
      }
      (this->assign_).trail.ebo_.size = uVar9;
      (this->assign_).front = uVar24;
      (this->assign_).units_ = uVar22;
      *(uint *)&this->field_0x204 = uVar17 & 0xc0000000 | uVar13;
    }
  }
  if (num != 0) {
    sVar10 = (this->watches_).ebo_.size;
    uVar14 = num;
    do {
      plVar2 = (this->watches_).ebo_.buf + (sVar10 - 1);
      if (*(int *)&(plVar2->super_type).
                   super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.field_0x8 < 0) {
        operator_delete((plVar2->super_type).
                        super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.buf_);
      }
      (plVar2->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.buf_ =
           (buf_type *)0x0;
      *(undefined8 *)
       &(plVar2->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.field_0x8
           = 0;
      (plVar2->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.right_ = 0;
      sVar10 = (this->watches_).ebo_.size;
      (this->watches_).ebo_.size = sVar10 - 1;
      plVar2 = (this->watches_).ebo_.buf + (sVar10 - 2);
      if (*(int *)&(plVar2->super_type).
                   super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.field_0x8 < 0) {
        operator_delete((plVar2->super_type).
                        super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.buf_);
      }
      uVar14 = uVar14 - 1;
      (plVar2->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.buf_ =
           (buf_type *)0x0;
      *(undefined8 *)
       &(plVar2->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.field_0x8
           = 0;
      (plVar2->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.right_ = 0;
      sVar10 = (this->watches_).ebo_.size - 1;
      (this->watches_).ebo_.size = sVar10;
    } while (uVar14 != 0);
  }
  if (popLearnt) {
    SharedContext::report(this->shared_,"removing aux constraints",this);
    uVar18 = (ulong)(this->learnts_).ebo_.size;
    local_58.data_ = 0;
    uStack_50 = 0;
    if (uVar18 != 0) {
      uVar16 = 0;
      uVar9 = 0;
      do {
        ppCVar8 = (this->learnts_).ebo_.buf;
        ppCVar8[uVar9] = ppCVar8[uVar16];
        iVar11 = (*(this->learnts_).ebo_.buf[uVar16]->_vptr_Constraint[9])();
        plVar21 = (long *)CONCAT44(extraout_var,iVar11);
        sVar1 = uVar9 + 1;
        if ((plVar21 != (long *)0x0) && (0x3fffffff < *(uint *)(plVar21 + 2))) {
          uStack_50 = uStack_50 & 0xffffffff00000000;
          (**(code **)(*plVar21 + 0xa0))(plVar21,&local_58);
          pLVar12 = std::
                    __find_if<Clasp::Literal*,__gnu_cxx::__ops::_Iter_pred<std::unary_negate<std::binder2nd<std::less<Clasp::Literal>>>>>
                              (local_58.data_,
                               (void *)(local_58.data_ + (uStack_50 & 0xffffffff) * 4),uVar3);
          if (pLVar12 != (Literal *)((uStack_50 & 0xffffffff) * 4 + local_58.data_)) {
            (**(code **)(*plVar21 + 0x28))(plVar21,this,1);
            sVar1 = uVar9;
          }
        }
        uVar9 = sVar1;
        uVar16 = uVar16 + 1;
      } while (uVar18 != uVar16);
      (this->learnts_).ebo_.size = uVar9;
      if ((void *)local_58.data_ != (void *)0x0) {
        operator_delete((void *)local_58.data_);
      }
    }
  }
  if (local_40 != (ConstraintDB *)0x0) {
    destroyDB(this,local_40);
  }
  ns = (this->assign_).assign_.ebo_.size - num;
  local_58.data_ = local_58.data_ & 0xffffffff00000000;
  bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&(this->assign_).assign_,ns,(uint *)&local_58);
  local_58.data_ = 0;
  bk_lib::pod_vector<Clasp::Antecedent,_std::allocator<Clasp::Antecedent>_>::resize
            (&(this->assign_).reason_.super_type,ns,&local_58);
  if ((this->assign_).assign_.ebo_.size - 1 < (this->tag_).rep_ >> 2) {
    (this->tag_).rep_ = 0;
  }
  plVar21 = (long *)((this->heuristic_).ptr_ & 0xfffffffffffffffe);
  (**(code **)(*plVar21 + 0x30))(plVar21,this,local_38,num);
  return (Literal)uVar3;
}

Assistant:

Literal Solver::popVars(uint32 num, bool popLearnt, ConstraintDB* popAux) {
	Literal pop = posLit(assign_.numVars() - num);
	uint32  dl  = decisionLevel() + 1;
	for (ImpliedList::iterator it = impliedLits_.begin(); it != impliedLits_.end(); ++it) {
		if (!(it->lit < pop)) { dl = std::min(dl, it->level); }
	}
	for (Var v = pop.var(), end = pop.var()+num; v != end; ++v) {
		if (value(v) != value_free) { dl = std::min(dl, level(v)); }
	}
	// 1. remove aux vars from assignment and watch lists
	if (dl > rootLevel()) {
		undoUntil(dl-1, undo_pop_proj_level);
	}
	else {
		popRootLevel((rootLevel() - dl) + 1);
		if (dl == 0) { // top-level has aux vars - cleanup manually
			uint32 j = shared_->numUnary();
			uint32 nUnits = assign_.units(), nFront = assign_.front, nSimps = lastSimp_;
			for (uint32 i = j, end = sizeVec(assign_.trail), endUnits = nUnits, endFront = nFront, endSimps = lastSimp_; i != end; ++i) {
				if (assign_.trail[i] < pop) { assign_.trail[j++] = assign_.trail[i]; }
				else {
					nUnits -= (i < endUnits);
					nFront -= (i < endFront);
					nSimps -= (i < endSimps);
				}
			}
			shrinkVecTo(assign_.trail, j);
			assign_.front = nFront;
			assign_.setUnits(nUnits);
			lastSimp_ = nSimps;
		}
	}
	for (uint32 n = num; n--;) {
		watches_.back().clear(true);
		watches_.pop_back();
		watches_.back().clear(true);
		watches_.pop_back();
	}
	// 2. remove learnt constraints over aux
	if (popLearnt) {
		shared_->report("removing aux constraints", this);
		ConstraintDB::size_type i, j, end = learnts_.size();
		LitVec cc;
		for (i = j = 0; i != end; ++i) {
			learnts_[j++] = learnts_[i];
			ClauseHead* c = learnts_[i]->clause();
			if (c && c->aux()) {
				cc.clear();
				c->toLits(cc);
				if (std::find_if(cc.begin(), cc.end(), std::not1(std::bind2nd(std::less<Literal>(), pop))) != cc.end()) {
					c->destroy(this, true);
					--j;
				}
			}
		}
		learnts_.erase(learnts_.begin()+j, learnts_.end());
	}
	if (popAux) { destroyDB(*popAux); }
	// 3. remove vars from solver and heuristic
	assign_.resize(assign_.numVars()-num);
	if (!validVar(tag_.var())) { tag_ = lit_true(); }
	heuristic_->updateVar(*this, pop.var(), num);
	return pop;
}